

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O3

void __thiscall AActor::Thrust(AActor *this,double speed)

{
  double dVar1;
  
  dVar1 = FFastTrig::cos(&fasttrig,
                         (this->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
  (this->Vel).X = dVar1 * speed + (this->Vel).X;
  dVar1 = FFastTrig::sin(&fasttrig,
                         (this->Angles).Yaw.Degrees * 11930464.711111112 + 6755399441055744.0);
  (this->Vel).Y = dVar1 * speed + (this->Vel).Y;
  return;
}

Assistant:

void Thrust(double speed)
	{
		Vel.X += speed * Angles.Yaw.Cos();
		Vel.Y += speed * Angles.Yaw.Sin();
	}